

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiskGen.cpp
# Opt level: O3

int __thiscall
DiskGen::LoadDisk(DiskGen *this,DataContainer *container,ILoadingProgress *loading_progress)

{
  IDisk *pIVar1;
  uint uVar2;
  int iVar3;
  vector<IDisk_*,_std::allocator<IDisk_*>_> disk_list;
  long *local_28;
  long *local_20;
  long local_18;
  
  (*(this->super_ITypeManager)._vptr_ITypeManager[0xc])
            (&local_28,this,container,loading_progress,this->log_);
  if (local_20 == local_28) {
    iVar3 = -1;
  }
  else {
    (*(this->super_ITypeManager)._vptr_ITypeManager[0xb])(this);
    pIVar1 = (IDisk *)*local_28;
    this->disk_ = pIVar1;
    pIVar1->fixed_speed_ = this->fixed_speed_;
    pIVar1->log_ = this->log_;
    this->current_side_ = 0;
    uVar2 = (*pIVar1->_vptr_IDisk[0xe])(pIVar1,0);
    if (uVar2 <= this->current_track_) {
      this->current_track_ = 0;
    }
    this->disk_present_ = true;
    iVar3 = 0;
  }
  if (local_28 != (long *)0x0) {
    operator_delete(local_28,local_18 - (long)local_28);
  }
  return iVar3;
}

Assistant:

int DiskGen::LoadDisk(DataContainer* container, ILoadingProgress* loading_progress)
{
   // Get proper IDisk
   std::vector<IDisk*> disk_list = CreateDisk(container, loading_progress, log_);

   // Load
   if (disk_list.size() == 0) return -1;

   CleanDisk();
   disk_ = disk_list[0];

   disk_->SetFixedSpeed(fixed_speed_);
   disk_->SetLog(log_);
   current_side_ = 0;

   // Juste check there is enough tracks...
   if (disk_->GetNumberOfTracks(0) <= current_track_)
      current_track_ = 0;

   disk_present_ = true;


   return 0;
}